

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_createJsonStringArray(csafestring_t *buffer,map2json_tree_t *tree)

{
  long in_RSI;
  map2json_tree_t *arrayObj;
  int i;
  undefined7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  csafestring_t *in_stack_ffffffffffffffe0;
  int local_14;
  
  safe_strchrappend(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  for (local_14 = 0; (long)local_14 < *(long *)(in_RSI + 0x18); local_14 = local_14 + 1) {
    for (in_stack_ffffffffffffffe0 = *(csafestring_t **)(in_RSI + 0x38);
        in_stack_ffffffffffffffe0 != (csafestring_t *)0x0;
        in_stack_ffffffffffffffe0 = (csafestring_t *)in_stack_ffffffffffffffe0[3].buffer_length) {
      if (in_stack_ffffffffffffffe0[1].data == (char *)(long)local_14) {
        map2json_createJsonString
                  (in_stack_ffffffffffffffe0,
                   (map2json_tree_t *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8))
        ;
      }
    }
    if ((long)local_14 < *(long *)(in_RSI + 0x18) + -1) {
      safe_strchrappend((csafestring_t *)0x0,in_stack_ffffffffffffffdf);
    }
  }
  safe_strchrappend(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  return;
}

Assistant:

static void map2json_createJsonStringArray(csafestring_t *buffer, map2json_tree_t *tree) {
	DEBUG_TEXT("map2json_createJsonStringArray(%s, [map2json_tree_t *])... ", buffer->data);

	int i;
	safe_strchrappend(buffer, JSON2MAP_MAP_ARRAY_START);

	for ( i = 0; i < tree->maxArrayId; i++ ) {
		map2json_tree_t *arrayObj = tree->arrayObjects;
		while ( arrayObj != NULL ) {
			if ( arrayObj->arrayId == i ) {
				map2json_createJsonString(buffer, arrayObj);
			}
			arrayObj = arrayObj->arrayObjects;
		}
		if ( i < tree->maxArrayId - 1 ) {
			safe_strchrappend(buffer, ',');
		}
	}
	safe_strchrappend(buffer, JSON2MAP_MAP_ARRAY_END);

	DEBUG_TEXT("map2json_createJsonStringArray(%s, [map2json_tree_t *])... DONE", buffer->data);
}